

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O1

void duckdb::EnumRangeBoundaryFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  uint32_t uVar1;
  reference pvVar2;
  Vector *this;
  idx_t iVar3;
  idx_t i;
  idx_t index;
  vector<duckdb::Value,_true> enum_values;
  vector<duckdb::LogicalType,_true> types;
  Value val;
  Value first_param;
  Value second_param;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_158;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_138;
  vector<duckdb::Value,_true> local_120;
  LogicalType local_108;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_138,input);
  DataChunk::GetValue(&local_b0,input,0,0);
  DataChunk::GetValue(&local_70,input,1,0);
  pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&local_138,(ulong)local_b0.is_null);
  this = EnumType::GetValuesInsertOrder(pvVar2);
  if (local_b0.is_null == false) {
    uVar1 = Value::GetValue<unsigned_int>(&local_b0);
    index = (idx_t)uVar1;
  }
  else {
    index = 0;
  }
  if (local_70.is_null == true) {
    pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)&local_138,0);
    iVar3 = EnumType::GetSize(pvVar2);
  }
  else {
    uVar1 = Value::GetValue<unsigned_int>(&local_70);
    iVar3 = (idx_t)(uVar1 + 1);
  }
  local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (index < iVar3) {
    do {
      Vector::GetValue(&local_f0,this,index);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158,&local_f0);
      Value::~Value(&local_f0);
      index = index + 1;
    } while (iVar3 != index);
  }
  LogicalType::LogicalType(&local_108,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120,&local_158);
  Value::LIST(&local_f0,&local_108,&local_120);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120);
  LogicalType::~LogicalType(&local_108);
  Vector::Reference(result,&local_f0);
  Value::~Value(&local_f0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158);
  Value::~Value(&local_70);
  Value::~Value(&local_b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_138);
  return;
}

Assistant:

static void EnumRangeBoundaryFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 2);
	idx_t start, end;
	auto first_param = input.GetValue(0, 0);
	auto second_param = input.GetValue(1, 0);

	auto &enum_vector =
	    first_param.IsNull() ? EnumType::GetValuesInsertOrder(types[1]) : EnumType::GetValuesInsertOrder(types[0]);

	if (first_param.IsNull()) {
		start = 0;
	} else {
		start = first_param.GetValue<uint32_t>();
	}
	if (second_param.IsNull()) {
		end = EnumType::GetSize(types[0]);
	} else {
		end = second_param.GetValue<uint32_t>() + 1;
	}
	vector<Value> enum_values;
	for (idx_t i = start; i < end; i++) {
		enum_values.emplace_back(enum_vector.GetValue(i));
	}
	auto val = Value::LIST(LogicalType::VARCHAR, enum_values);
	result.Reference(val);
}